

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void M_AddVal(Matrix *M,size_t RoC,size_t Entry,Real Val)

{
  LASErrIdType LVar1;
  Real Val_local;
  size_t Entry_local;
  size_t RoC_local;
  Matrix *M_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if ((((M->ElOrder == Rowws) && (RoC != 0)) && (RoC <= M->RowDim)) ||
       (((M->ElOrder == Clmws && (RoC != 0)) && ((RoC <= M->ClmDim && (Entry < M->Len[RoC])))))) {
      M->El[RoC][Entry].Val = Val + M->El[RoC][Entry].Val;
    }
    else {
      LASError(LASRangeErr,"M_AddVal",M->Name,(char *)0x0,(char *)0x0);
    }
  }
  return;
}

Assistant:

void M_AddVal(Matrix *M, size_t RoC, size_t Entry, Real Val)
/* add a value to a matrix entry */
{
    if (LASResult() == LASOK) {
        if ((M->ElOrder == Rowws && RoC > 0 && RoC <= M->RowDim) ||
            ((M->ElOrder == Clmws && RoC > 0 && RoC <= M->ClmDim) &&
            (Entry < M->Len[RoC])))
            M->El[RoC][Entry].Val += Val;
        else
            LASError(LASRangeErr, "M_AddVal", M->Name, NULL, NULL);
    }
}